

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

ReshapeLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_reshape(NeuralNetworkLayer *this)

{
  bool bVar1;
  ReshapeLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_reshape(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_reshape(this);
    this_00 = (ReshapeLayerParams *)operator_new(0x30);
    ReshapeLayerParams::ReshapeLayerParams(this_00);
    (this->layer_).reshape_ = this_00;
  }
  return (ReshapeLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::ReshapeLayerParams* NeuralNetworkLayer::mutable_reshape() {
  if (!has_reshape()) {
    clear_layer();
    set_has_reshape();
    layer_.reshape_ = new ::CoreML::Specification::ReshapeLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.reshape)
  return layer_.reshape_;
}